

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.cpp
# Opt level: O3

void vera::image(TextureStream *_stream)

{
  col_type *pcVar1;
  Shader *pSVar2;
  DefaultShaders _type;
  DefaultShaders _type_00;
  mat4 local_88;
  string local_48;
  
  if (billboard_shader == (Shader *)0x0) {
    pSVar2 = (Shader *)operator_new(0x100);
    Shader::Shader(pSVar2);
    billboard_shader = pSVar2;
    getDefaultSrc_abi_cxx11_((string *)&local_88,(vera *)0x7,_type);
    getDefaultSrc_abi_cxx11_(&local_48,(vera *)0x6,_type_00);
    Shader::setSource(pSVar2,(string *)&local_88,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if ((col_type *)CONCAT44(local_88.value[0].field_1,local_88.value[0].field_0) !=
        local_88.value + 1) {
      operator_delete((undefined1 *)CONCAT44(local_88.value[0].field_1,local_88.value[0].field_0));
    }
  }
  Shader::use(billboard_shader);
  pSVar2 = billboard_shader;
  pcVar1 = local_88.value + 1;
  local_88.value[0]._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"u_depth","");
  Shader::setUniform(pSVar2,(string *)&local_88,0.0);
  if ((col_type *)local_88.value[0]._0_8_ != pcVar1) {
    operator_delete((void *)local_88.value[0]._0_8_);
  }
  pSVar2 = billboard_shader;
  local_88.value[0]._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"u_scale","");
  Shader::setUniform(pSVar2,(string *)&local_88,1.0,1.0);
  if ((col_type *)local_88.value[0]._0_8_ != pcVar1) {
    operator_delete((void *)local_88.value[0]._0_8_);
  }
  pSVar2 = billboard_shader;
  local_88.value[0]._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"u_translate","");
  Shader::setUniform(pSVar2,(string *)&local_88,0.0,0.0);
  if ((col_type *)local_88.value[0]._0_8_ != pcVar1) {
    operator_delete((void *)local_88.value[0]._0_8_);
  }
  pSVar2 = billboard_shader;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"u_modelViewProjectionMatrix","");
  local_88.value[0].field_0.x = 1.0;
  local_88.value[0].field_1.y = 0.0;
  local_88.value[0].field_2.z = 0.0;
  local_88.value._12_8_ = 0;
  local_88.value[1].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x3f800000;
  local_88.value[1].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  local_88.value[1].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
  local_88.value[2].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  local_88.value[2].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  local_88.value[2].field_2.z = 1.0;
  local_88.value[2].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
  local_88.value[3].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  local_88.value[3].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  local_88.value[3].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  local_88.value[3].field_3.w = 1.0;
  Shader::setUniform(pSVar2,&local_48,&local_88,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  pSVar2 = billboard_shader;
  local_88.value[0]._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"u_tex0","");
  Shader::setUniformTexture(pSVar2,(string *)&local_88,&_stream->super_Texture,0);
  if ((col_type *)local_88.value[0]._0_8_ != pcVar1) {
    operator_delete((void *)local_88.value[0]._0_8_);
  }
  Vbo::render(billboard_vbo,billboard_shader);
  return;
}

Assistant:

void image(const TextureStream *_stream) {
    if (billboard_shader == nullptr) {
        billboard_shader = new Shader();
        billboard_shader->setSource( getDefaultSrc(FRAG_DYNAMIC_BILLBOARD), getDefaultSrc(VERT_DYNAMIC_BILLBOARD) );
    }

    billboard_shader->use();
    billboard_shader->setUniform("u_depth", 0.0f);
    billboard_shader->setUniform("u_scale", 1.0f, 1.0f);
    billboard_shader->setUniform("u_translate", 0.0f, 0.0f);
    billboard_shader->setUniform("u_modelViewProjectionMatrix", glm::mat4(1.0) );
    billboard_shader->setUniformTexture("u_tex0", _stream, 0);
    billboard_vbo->render( billboard_shader );
}